

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool trans_SMC(DisasContext_conflict1 *s,arg_SMC *a)

{
  TCGContext_conflict1 *pTVar1;
  uintptr_t o;
  TCGv_i32 pTVar2;
  uint uVar3;
  TCGContext_conflict1 *tcg_ctx;
  TCGTemp *local_38;
  TCGTemp *local_30;
  
  uVar3 = (uint)s->features & 0x210;
  if (uVar3 == 0x10) {
    if (s->user == 0) {
      pTVar1 = s->uc->tcg_ctx;
      tcg_gen_op2_aarch64(pTVar1,INDEX_op_movi_i32,(TCGArg)(pTVar1->cpu_R[0xf] + (long)pTVar1),
                          (long)(int)s->pc_curr);
      pTVar2 = tcg_const_i32_aarch64(pTVar1,0x4e000000);
      local_38 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
      local_30 = (TCGTemp *)(pTVar2 + (long)pTVar1);
      tcg_gen_callN_aarch64(pTVar1,helper_pre_smc_aarch64,(TCGTemp *)0x0,2,&local_38);
      tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(pTVar2 + (long)pTVar1));
      pTVar1 = s->uc->tcg_ctx;
      tcg_gen_op2_aarch64(pTVar1,INDEX_op_movi_i32,(TCGArg)(pTVar1->cpu_R[0xf] + (long)pTVar1),
                          (long)(int)(s->base).pc_next);
      (s->base).is_jmp = DISAS_TARGET_6;
    }
    else {
      unallocated_encoding_aarch64(s);
    }
  }
  return uVar3 == 0x10;
}

Assistant:

static bool trans_SMC(DisasContext *s, arg_SMC *a)
{
    if (!ENABLE_ARCH_6K || arm_dc_feature(s, ARM_FEATURE_M)) {
        return false;
    }
    if (IS_USER(s)) {
        unallocated_encoding(s);
    } else {
        gen_smc(s);
    }
    return true;
}